

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

Options * __thiscall smf::Options::getString(Options *this,string *optionName)

{
  reference ppOVar1;
  string *psVar2;
  string *in_RDX;
  allocator local_25;
  int local_24;
  int index;
  string *optionName_local;
  Options *this_local;
  
  optionName_local = optionName;
  this_local = this;
  local_24 = getRegIndex((Options *)optionName,in_RDX);
  if (local_24 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"UNKNOWN OPTION",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else {
    ppOVar1 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[]((vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_> *)
                         (optionName + 0x60),(long)local_24);
    psVar2 = Option_register::getOption_abi_cxx11_(*ppOVar1);
    std::__cxx11::string::string((string *)this,(string *)psVar2);
  }
  return this;
}

Assistant:

std::string Options::getString(const std::string& optionName) {
   int index = getRegIndex(optionName);
   if (index < 0) {
      return "UNKNOWN OPTION";
   } else {
      return m_optionRegister[index]->getOption();
   }
}